

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58_tests.cpp
# Opt level: O2

void __thiscall
base58_tests::base58_random_encode_decode::test_method(base58_random_encode_decode *this)

{
  long lVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v1;
  readonly_property<bool> rVar3;
  int iVar4;
  uint uVar5;
  uint64_t uVar6;
  uint range;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Span<const_unsigned_char> input;
  const_string file;
  const_string file_00;
  const_string file_01;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  check_type cVar10;
  RandomMixin<FastRandomContext> *this_00;
  RandomMixin<FastRandomContext> *this_01;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  lazy_ostream local_100;
  undefined1 *local_f0;
  char **local_e8;
  assertion_result local_e0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string encoded;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.super_RandomMixin<FastRandomContext>;
  iVar4 = 1000;
  while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
    this_00 = this_01;
    uVar6 = RandomMixin<FastRandomContext>::randbits(this_01,8);
    bVar9 = RandomMixin<FastRandomContext>::randbool(this_01);
    uVar5 = 0;
    iVar2 = (int)uVar6;
    this_01 = this_00;
    if (bVar9) {
      uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_int>(this_00,iVar2 + 2);
      this_01 = this_00;
    }
    local_100._vptr_lazy_ostream =
         (_func_int **)((ulong)local_100._vptr_lazy_ostream & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,(ulong)uVar5,
               (value_type_conflict3 *)&local_100,(allocator_type *)&decoded);
    range = iVar2 + 1;
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&encoded,this_01,
               (ulong)(range - uVar5));
    v1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffe5c;
    v1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffe58;
    v1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_cVar10;
    v1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this_01;
    Cat<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&data,v1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&encoded);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
    input.m_size = (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
    input.m_data = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    EncodeBase58Check_abi_cxx11_(&encoded,input);
    decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_int>(this_01,range);
    bVar9 = DecodeBase58Check(&encoded,&decoded,uVar5);
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x5e;
    file.m_begin = (iterator)&local_b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c8,msg);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar9;
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = "!ok_too_small";
    local_108 = "";
    local_100.m_empty = false;
    local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = &local_110;
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_118 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,&local_100,1,0,WARN,_cVar10,(size_t)&local_120,0x5e);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_int>(this_01,0x100 - iVar2);
    rVar3.super_class_property<bool>.value =
         (class_property<bool>)DecodeBase58Check(&encoded,&decoded,range + uVar5);
    local_130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar8;
    msg_00.m_begin = pvVar7;
    file_00.m_end = (iterator)0x60;
    file_00.m_begin = (iterator)&local_130;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
               msg_00);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = "ok";
    local_108 = "";
    local_100.m_empty = false;
    local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = &local_110;
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_148 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,&local_100,1,0,WARN,_cVar10,(size_t)&local_150,0x60);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    local_160 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar8;
    msg_01.m_begin = pvVar7;
    file_01.m_end = (iterator)0x61;
    file_01.m_begin = (iterator)&local_160;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
               msg_01);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)std::operator==(&data,&decoded);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = "data == decoded";
    local_108 = "";
    local_100.m_empty = false;
    local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = &local_110;
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_178 = "";
    in_stack_fffffffffffffe58 = 0;
    in_stack_fffffffffffffe5c = 0;
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,&local_100,1,0,WARN,_cVar10,(size_t)&local_180,0x61);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::~string((string *)&encoded);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(base58_random_encode_decode)
{
    for (int n = 0; n < 1000; ++n) {
        unsigned int len = 1 + m_rng.randbits(8);
        unsigned int zeroes = m_rng.randbool() ? m_rng.randrange(len + 1) : 0;
        auto data = Cat(std::vector<unsigned char>(zeroes, '\000'), m_rng.randbytes(len - zeroes));
        auto encoded = EncodeBase58Check(data);
        std::vector<unsigned char> decoded;
        auto ok_too_small = DecodeBase58Check(encoded, decoded, m_rng.randrange(len));
        BOOST_CHECK(!ok_too_small);
        auto ok = DecodeBase58Check(encoded, decoded, len + m_rng.randrange(257 - len));
        BOOST_CHECK(ok);
        BOOST_CHECK(data == decoded);
    }
}